

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsenumber.cpp
# Opt level: O2

NumberType ICM::Parser::parseInteger(string *str,uint64_t *value,bool minus,Format format)

{
  uint64_t uVar1;
  undefined7 in_register_00000011;
  NumberType NVar2;
  char *__lhs;
  allocator local_59;
  string local_58;
  string s;
  
  __lhs = "";
  if ((int)CONCAT71(in_register_00000011,minus) != 0) {
    __lhs = "-";
  }
  std::operator+(&s,__lhs,str);
  std::__cxx11::string::string((string *)&local_58,s._M_dataplus._M_p,&local_59);
  uVar1 = std::__cxx11::stoll(&local_58,(size_t *)0x0,format);
  *value = uVar1;
  std::__cxx11::string::~string((string *)&local_58);
  uVar1 = *value;
  if ((long)(char)uVar1 == uVar1) {
    NVar2 = nt_int8;
  }
  else if ((long)(short)uVar1 == uVar1) {
    NVar2 = nt_int16;
  }
  else {
    NVar2 = ((long)(int)uVar1 != uVar1) + nt_int32;
  }
  std::__cxx11::string::~string((string *)&s);
  return NVar2;
}

Assistant:

static NumberType parseInteger(const string &str, uint64_t &value, bool minus, Format format)
		{
			string s = (minus ? "-" : "") + str;
			(int64_t&)value = std::stoll(s.c_str(), 0, format);
			return getLimitTypeInt(value);
		}